

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  int iVar1;
  int local_28;
  int local_24;
  int i_1;
  int i;
  _GLFWwindow *window;
  int value_local;
  int mode_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (mode == 0x33001) {
      if (((value == 0x34001) || (value == 0x34002)) || (value == 0x34003)) {
        if (*(int *)(handle + 0x70) != value) {
          *(int *)(handle + 0x70) = value;
          _glfwPlatformGetCursorPos
                    ((_GLFWwindow *)handle,(double *)(handle + 0x1e0),(double *)(handle + 0x1e8));
          iVar1 = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
          if (iVar1 != 0) {
            _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
          }
        }
      }
      else {
        _glfwInputError(0x10003,"Invalid cursor mode %i",(ulong)(uint)value);
      }
    }
    else if (mode == 0x33002) {
      if (*(int *)(handle + 0x68) != value) {
        if (value == 0) {
          for (local_24 = 0; local_24 < 0x15d; local_24 = local_24 + 1) {
            if (handle[(long)local_24 + 0x7c] == (GLFWwindow)0x3) {
              handle[(long)local_24 + 0x7c] = (GLFWwindow)0x0;
            }
          }
        }
        *(uint *)(handle + 0x68) = (uint)(value != 0);
      }
    }
    else if (mode == 0x33003) {
      if (*(int *)(handle + 0x6c) != value) {
        if (value == 0) {
          for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
            if (handle[(long)local_28 + 0x74] == (GLFWwindow)0x3) {
              handle[(long)local_28 + 0x74] = (GLFWwindow)0x0;
            }
          }
        }
        *(uint *)(handle + 0x6c) = (uint)(value != 0);
      }
    }
    else {
      _glfwInputError(0x10003,"Invalid input mode %i",(ulong)(uint)mode);
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/glfw/src/input.c"
                ,0xae,"void glfwSetInputMode(GLFWwindow *, int, int)");
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
        {
            if (value != GLFW_CURSOR_NORMAL &&
                value != GLFW_CURSOR_HIDDEN &&
                value != GLFW_CURSOR_DISABLED)
            {
                _glfwInputError(GLFW_INVALID_ENUM,
                                "Invalid cursor mode %i",
                                value);
                return;
            }

            if (window->cursorMode == value)
                return;

            window->cursorMode = value;

            _glfwPlatformGetCursorPos(window,
                                      &window->virtualCursorPosX,
                                      &window->virtualCursorPosY);

            if (_glfwPlatformWindowFocused(window))
                _glfwPlatformSetCursorMode(window, value);

            return;
        }

        case GLFW_STICKY_KEYS:
        {
            if (window->stickyKeys == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky keys
                for (i = 0;  i <= GLFW_KEY_LAST;  i++)
                {
                    if (window->keys[i] == _GLFW_STICK)
                        window->keys[i] = GLFW_RELEASE;
                }
            }

            window->stickyKeys = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }

        case GLFW_STICKY_MOUSE_BUTTONS:
        {
            if (window->stickyMouseButtons == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky mouse buttons
                for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
                {
                    if (window->mouseButtons[i] == _GLFW_STICK)
                        window->mouseButtons[i] = GLFW_RELEASE;
                }
            }

            window->stickyMouseButtons = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode %i", mode);
}